

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O0

Vec_Int_t * Ree_ManDeriveAdds(Hash_IntMan_t *p,Vec_Int_t *vData,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Wec_t *p_03;
  Vec_Wec_t *p_04;
  Hash_IntObj_t *pHVar7;
  bool local_121;
  uint local_ec;
  int SignXor;
  int n;
  int SignMaj [8];
  int SignAnd [8];
  Hash_IntObj_t *pObj;
  Vec_Int_t *vMajOne;
  Vec_Int_t *vXorOne;
  Vec_Wec_t *vMajMap;
  Vec_Wec_t *vXorMap;
  Vec_Int_t *vIndexRev;
  Vec_Int_t *vIndex;
  Vec_Int_t *vMajs;
  Vec_Int_t *vXors;
  Vec_Int_t *vAdds;
  int local_48;
  int nEntries;
  int Index;
  int CountM;
  int CountX;
  int Truth2;
  int Truth;
  int Value;
  int iObj2;
  int iObj;
  int k;
  int j;
  int i;
  int fVerbose_local;
  Vec_Int_t *vData_local;
  Hash_IntMan_t *p_local;
  
  local_48 = 0;
  iVar1 = Hash_IntManEntryNum(p);
  p_00 = Vec_IntAlloc(1000);
  pVVar5 = Vec_IntStart(iVar1 + 1);
  pVVar6 = Vec_IntStart(iVar1 + 1);
  p_01 = Vec_IntStartFull(iVar1 + 1);
  p_02 = Vec_IntAlloc(1000);
  for (k = 0; iVar2 = Vec_IntSize(vData), k + 2 < iVar2; k = k + 3) {
    Vec_IntEntry(vData,k);
    iVar2 = Vec_IntEntry(vData,k + 1);
    iVar3 = Vec_IntEntry(vData,k + 2);
    if (iVar1 < iVar2) {
      __assert_fail("Value <= nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                    ,0x154,"Vec_Int_t *Ree_ManDeriveAdds(Hash_IntMan_t *, Vec_Int_t *, int)");
    }
    if ((((iVar3 == 0x66) || (iVar3 == 0x99)) || (iVar3 == 0x69)) || (iVar3 == 0x96)) {
      Vec_IntAddToEntry(pVVar5,iVar2,1);
    }
    else {
      Vec_IntAddToEntry(pVVar6,iVar2,1);
    }
  }
  for (k = 0; iVar1 = Vec_IntSize(pVVar5), k < iVar1; k = k + 1) {
    iVar1 = Vec_IntEntry(pVVar5,k);
    iVar2 = Vec_IntEntry(pVVar6,k);
    if ((iVar1 != 0) && (iVar2 != 0)) {
      Vec_IntPush(p_02,k);
      Vec_IntWriteEntry(p_01,k,local_48);
      local_48 = local_48 + 1;
    }
  }
  Vec_IntFree(pVVar5);
  Vec_IntFree(pVVar6);
  p_03 = Vec_WecStart(local_48);
  p_04 = Vec_WecStart(local_48);
  for (k = 0; iVar1 = Vec_IntSize(vData), k + 2 < iVar1; k = k + 3) {
    iVar1 = Vec_IntEntry(vData,k);
    iVar2 = Vec_IntEntry(vData,k + 1);
    iVar3 = Vec_IntEntry(vData,k + 2);
    iVar2 = Vec_IntEntry(p_01,iVar2);
    if (iVar2 != -1) {
      if (((iVar3 == 0x66) || (iVar3 == 0x99)) || ((iVar3 == 0x69 || (iVar3 == 0x96)))) {
        pVVar5 = Vec_WecEntry(p_03,iVar2);
        Vec_IntPushTwo(pVVar5,iVar1,iVar3);
      }
      else {
        pVVar5 = Vec_WecEntry(p_04,iVar2);
        Vec_IntPushTwo(pVVar5,iVar1,iVar3);
      }
    }
  }
  Vec_IntFree(p_01);
  k = 0;
  do {
    iVar1 = Vec_IntSize(p_02);
    if (iVar1 <= k) {
      Vec_IntFree(p_02);
      Vec_WecFree(p_03);
      Vec_WecFree(p_04);
      return p_00;
    }
    iVar1 = Vec_IntEntry(p_02,k);
    pVVar5 = Vec_WecEntry(p_03,k);
    pVVar6 = Vec_WecEntry(p_04,k);
    pHVar7 = Hash_IntObj(p,iVar1);
    for (iObj = 0; iVar1 = Vec_IntSize(pVVar5), iObj + 1 < iVar1; iObj = iObj + 2) {
      iVar1 = Vec_IntEntry(pVVar5,iObj);
      iVar2 = Vec_IntEntry(pVVar5,iObj + 1);
      for (iObj2 = 0; iVar3 = Vec_IntSize(pVVar6), iObj2 + 1 < iVar3; iObj2 = iObj2 + 2) {
        iVar3 = Vec_IntEntry(pVVar6,iObj2);
        iVar4 = Vec_IntEntry(pVVar6,iObj2 + 1);
        SignMaj[6] = 0x88;
        SignMaj[7] = 0x44;
        _SignXor = 0xd4000000e8;
        SignMaj[0] = 0xb2;
        SignMaj[1] = 0x71;
        SignMaj[2] = 0x8e;
        SignMaj[3] = 0x4d;
        SignMaj[4] = 0x2b;
        SignMaj[5] = 0x17;
        local_121 = iVar2 == 0x99 || iVar2 == 0x69;
        for (local_ec = 0; ((int)local_ec < 8 && (iVar4 != (&SignXor)[(int)local_ec]));
            local_ec = local_ec + 1) {
        }
        if (local_ec == 8) {
          local_ec = 0;
          while (((int)local_ec < 8 && (iVar4 != SignMaj[(long)(int)local_ec + 6]))) {
            local_ec = local_ec + 1;
          }
        }
        if (7 < (int)local_ec) {
          __assert_fail("n < 8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                        ,0x186,"Vec_Int_t *Ree_ManDeriveAdds(Hash_IntMan_t *, Vec_Int_t *, int)");
        }
        Vec_IntPushThree(p_00,pHVar7->iData0,pHVar7->iData1,pHVar7->iData2);
        Vec_IntPushThree(p_00,iVar1,iVar3,(uint)local_121 << 3 | local_ec);
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Ree_ManDeriveAdds( Hash_IntMan_t * p, Vec_Int_t * vData, int fVerbose )
{
    int i, j, k, iObj, iObj2, Value, Truth, Truth2, CountX, CountM, Index = 0;
    int nEntries = Hash_IntManEntryNum(p);
    Vec_Int_t * vAdds = Vec_IntAlloc( 1000 );
    Vec_Int_t * vXors = Vec_IntStart( nEntries + 1 );
    Vec_Int_t * vMajs = Vec_IntStart( nEntries + 1 );
    Vec_Int_t * vIndex = Vec_IntStartFull( nEntries + 1 );
    Vec_Int_t * vIndexRev = Vec_IntAlloc( 1000 );
    Vec_Wec_t * vXorMap, * vMajMap;
    Vec_IntForEachEntryTriple( vData, iObj, Value, Truth, i )
    {
        assert( Value <= nEntries );
        if ( Truth == 0x66 || Truth == 0x99 || Truth == 0x69 || Truth == 0x96 )
            Vec_IntAddToEntry( vXors, Value, 1 );
        else
            Vec_IntAddToEntry( vMajs, Value, 1 );
    }
    // remap these into indexes
    Vec_IntForEachEntryTwo( vXors, vMajs, CountX, CountM, i )
        if ( CountX && CountM )
        {
            Vec_IntPush( vIndexRev, i );
            Vec_IntWriteEntry( vIndex, i, Index++ );
        }
    Vec_IntFree( vXors );
    Vec_IntFree( vMajs );
    //if ( fVerbose )
    //    printf( "Detected %d shared cuts among %d hashed cuts.\n", Index, nEntries );
    // collect nodes
    vXorMap = Vec_WecStart( Index );
    vMajMap = Vec_WecStart( Index );
    Vec_IntForEachEntryTriple( vData, iObj, Value, Truth, i )
    {
        Index = Vec_IntEntry( vIndex, Value );
        if ( Index == -1 )
            continue;
        if ( Truth == 0x66 || Truth == 0x99 || Truth == 0x69 || Truth == 0x96 )
            Vec_IntPushTwo( Vec_WecEntry(vXorMap, Index), iObj, Truth );
        else
            Vec_IntPushTwo( Vec_WecEntry(vMajMap, Index), iObj, Truth );
    }
    Vec_IntFree( vIndex );
    // create pairs
    Vec_IntForEachEntry( vIndexRev, Value, i )
    {
        Vec_Int_t * vXorOne = Vec_WecEntry( vXorMap, i );
        Vec_Int_t * vMajOne = Vec_WecEntry( vMajMap, i );
        Hash_IntObj_t * pObj = Hash_IntObj( p, Value );
        Vec_IntForEachEntryDouble( vXorOne, iObj, Truth, j )
        Vec_IntForEachEntryDouble( vMajOne, iObj2, Truth2, k )
        {
            int SignAnd[8] = {0x88, 0x44, 0x22, 0x11, 0x77, 0xBB, 0xDD, 0xEE};
            int SignMaj[8] = {0xE8, 0xD4, 0xB2, 0x71, 0x8E, 0x4D, 0x2B, 0x17};
            int n, SignXor = (Truth == 0x99 || Truth == 0x69) << 3;
            for ( n = 0; n < 8; n++ )
                if ( Truth2 == SignMaj[n] )
                    break;
            if ( n == 8 ) 
                for ( n = 0; n < 8; n++ )
                    if ( Truth2 == SignAnd[n] )
                        break;
            assert( n < 8 );
            Vec_IntPushThree( vAdds, pObj->iData0, pObj->iData1, pObj->iData2 ); 
            Vec_IntPushThree( vAdds, iObj, iObj2, SignXor | n );
        }
    }
    Vec_IntFree( vIndexRev );
    Vec_WecFree( vXorMap );
    Vec_WecFree( vMajMap );
    return vAdds;
}